

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall front::syntax::SyntaxAnalyze::gm_func_def(SyntaxAnalyze *this)

{
  uint layerNum;
  pointer pWVar1;
  pointer pcVar2;
  string name_00;
  undefined1 this_00 [8];
  pointer ppVar3;
  pointer psVar4;
  bool bVar5;
  SymbolKind SVar6;
  ulong uVar7;
  FunctionSymbol *this_01;
  pointer psVar8;
  pointer ppVar9;
  shared_ptr<front::symbol::Symbol> var;
  SharedSyPtr func;
  pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  var_1;
  string name;
  vector<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  genValues;
  vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  params;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paramsName;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined8 in_stack_fffffffffffffdc8;
  irGenerator *this_02;
  value_type local_228;
  undefined1 local_218 [24];
  undefined1 auStack_200 [8];
  undefined1 local_1f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 *local_1c8;
  long local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  vector<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  local_188;
  string local_168;
  SharedSyPtr local_148;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  undefined1 local_120 [20];
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  byte local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined8 local_e8;
  long *local_d8 [2];
  long local_c8 [2];
  string local_b8;
  string local_98;
  string local_78;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  byte local_38;
  
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = 0;
  local_188.
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8 = 0;
  local_f8._M_allocated_capacity = 0;
  local_f8._8_8_ = 0;
  local_1a8.
  super__Vector_base<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_1a8.
  super__Vector_base<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_218._16_8_ = (element_type *)0x0;
  auStack_200 = (undefined1  [8])0x0;
  uVar7 = this->matched_index + 1;
  pWVar1 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar7 < (ulong)(((long)(this->word_list->
                             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                     -0x5555555555555555)) {
    bVar5 = word::Word::match_token(pWVar1 + uVar7,INTTK);
    if (!bVar5) goto LAB_0019e0eb;
    SVar6 = INT;
    match_one_word(this,INTTK);
  }
  else {
LAB_0019e0eb:
    SVar6 = VID;
    match_one_word(this,VOIDTK);
  }
  match_one_word(this,IDENFR);
  word::Word::get_self_abi_cxx11_
            ((string *)local_1f8,
             (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + this->matched_index);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1f8);
  if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  layerNum = this->layer_num;
  this_01 = (FunctionSymbol *)operator_new(0x50);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_1c8,local_1c8 + local_1c0);
  symbol::FunctionSymbol::FunctionSymbol(this_01,&local_98,SVar6,layerNum);
  std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
  reset<front::symbol::FunctionSymbol>
            ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)(local_218 + 0x10),
             this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_148.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_218._16_8_;
  local_148.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_200;
  if (auStack_200 != (undefined1  [8])0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)((long)auStack_200 + 8U) = *(_Atomic_word *)((long)auStack_200 + 8U) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)((long)auStack_200 + 8U) = *(_Atomic_word *)((long)auStack_200 + 8U) + 1;
    }
  }
  symbolTable::SymbolTable::push_symbol(&this->symbolTable,&local_148);
  if (local_148.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_1c8,local_1c8 + local_1c0);
  this_02 = &this->irGenerator;
  irGenerator::irGenerator::getFunctionName(&local_78,this_02,&local_b8);
  irGenerator::irGenerator::ir_declare_function(this_02,&local_78,SVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  match_one_word(this,LPARENT);
  uVar7 = this->matched_index + 1;
  pWVar1 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar7 < (ulong)(((long)(this->word_list->
                             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                     -0x5555555555555555)) {
    bVar5 = word::Word::match_token(pWVar1 + uVar7,RPARENT);
    if (bVar5) goto LAB_0019e339;
  }
  gm_func_param(this,&local_188,layerNum,&local_1a8);
  while( true ) {
    uVar7 = this->matched_index + 1;
    pWVar1 = (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->word_list->
                       super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
               -0x5555555555555555) <= uVar7) break;
    bVar5 = word::Word::match_token(pWVar1 + uVar7,COMMA);
    if (!bVar5) break;
    match_one_word(this,COMMA);
    gm_func_param(this,&local_188,layerNum,&local_1a8);
  }
LAB_0019e339:
  psVar4 = local_188.
           super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_188.
      super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_188.
      super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar8 = local_188.
             super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = auStack_200;
      local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar8->super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (psVar8->super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
      if (local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (auStack_200 != (undefined1  [8])0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)auStack_200 + 8U) = *(_Atomic_word *)((long)auStack_200 + 8U) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)auStack_200 + 8U) = *(_Atomic_word *)((long)auStack_200 + 8U) + 1;
        }
      }
      std::
      vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
      ::push_back((vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
                   *)&((element_type *)(local_218._16_8_ + 0x30))->_name,&local_228);
      if (this_00 != (undefined1  [8])0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      pcVar2 = ((local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name)._M_dataplus._M_p;
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d8,pcVar2,
                 pcVar2 + ((local_228.
                            super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->_name)._M_string_length);
      name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffdbc;
      name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffdb8;
      name_00._M_string_length = (size_type)this;
      name_00.field_2._M_allocated_capacity = in_stack_fffffffffffffdc8;
      name_00.field_2._8_8_ = this_02;
      irGenerator::irGenerator::getVarName
                ((string *)local_1f8,this_02,name_00,(uint32_t)(string *)local_d8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_f8._M_local_buf,(string *)local_1f8);
      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      if (local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar4);
  }
  irGenerator::irGenerator::ir_finish_param_declare
            (this_02,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_f8);
  ppVar3 = local_1a8.
           super__Vector_base<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1a8.
      super__Vector_base<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1a8.
      super__Vector_base<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar9 = local_1a8.
             super__Vector_base<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair((pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1f8,ppVar9);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_168,*(long *)(local_1f8._0_8_ + 8),
                 *(long *)(local_1f8._0_8_ + 0x10) + *(long *)(local_1f8._0_8_ + 8));
      SVar6 = (*(code *)**(undefined8 **)local_1f8._0_8_)();
      local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      irGenerator::irGenerator::ir_declare_value
                (this_02,&local_168,SVar6,*(int *)(local_1f8._0_8_ + 0x2c),&local_138,Var,0);
      if (local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_138.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_218;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,*(long *)(local_1f8._0_8_ + 8),
                 *(long *)(local_1f8._0_8_ + 0x10) + *(long *)(local_1f8._0_8_ + 8));
      local_120._0_8_ = local_120 + 0x10;
      if (local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)local_218) {
        uStack_108 = local_218._8_4_;
        uStack_104 = local_218._12_4_;
      }
      else {
        local_120._0_8_ =
             local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      uStack_10c = local_218._4_4_;
      local_120._16_4_ = local_218._0_4_;
      local_120._8_8_ =
           local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_218._0_4_ = local_218._0_4_ & 0xffffff00;
      local_100 = 1;
      local_58[0] = local_48;
      local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_218;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,local_1f8._16_8_,local_1f8._24_8_ + local_1f8._16_8_);
      local_38 = 2;
      irGenerator::irGenerator::ir_assign(this_02,(LeftVal *)local_120,(RightVal *)local_58);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_38]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffffdcf,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_58);
      local_38 = 0xff;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_100]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffffdcf,
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_120);
      local_100 = 0xff;
      if (local_228.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_218) {
        operator_delete(local_228.
                        super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,CONCAT44(local_218._4_4_,local_218._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._16_8_ != &local_1d8) {
        operator_delete((void *)local_1f8._16_8_,local_1d8._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
      }
      ppVar9 = ppVar9 + 1;
    } while (ppVar9 != ppVar3);
  }
  match_one_word(this,RPARENT);
  gm_block(this);
  irGenerator::irGenerator::ir_leave_function(this_02);
  if (auStack_200 != (undefined1  [8])0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_200);
  }
  std::
  vector<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f8);
  std::
  vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ::~vector(&local_188);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_var_def() {
  string name;
  SymbolKind kind;
  SharedExNdPtr dimension;
  vector<SharedExNdPtr> dimensions;
  vector<SharedExNdPtr> init_values;
  SharedSyPtr symbol;
  irGenerator::localArrayInitType initType;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    kind = SymbolKind::Array;
    while (try_word(1, Token::LBRACK)) {
      match_one_word(Token::LBRACK);
      dimension = gm_const_exp();
      dimensions.push_back(dimension);
      match_one_word(Token::RBRACK);
    }
  } else {
    kind = SymbolKind::INT;
  }

  if (try_word(1, Token::ASSIGN)) {
    match_one_word(Token::ASSIGN);
    if (try_word(1, Token::LBRACE)) {
      match_one_word(Token::LBRACE);
      gm_init_val(init_values, dimensions, 0);
      match_one_word(Token::RBRACE);
    } else {
      gm_init_val(init_values, dimensions, 0);
    }
  }

  if (kind == SymbolKind::INT) {
    symbol.reset(new IntSymbol(name, layer_num, false));
    irGenerator.ir_declare_value(name, kind, symbol->getId(), {});
  } else {
    vector<uint32_t> inits;

    symbol.reset(new ArraySymbol(name, IntSymbol::getHolderIntSymbol(),
                                 layer_num, false, false));
    for (auto var : dimensions) {
      std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(var);
    }

    if (inGlobalLayer()) {
      if (init_values.empty()) {
        for (int i = 0;
             i < std::static_pointer_cast<ArraySymbol>(symbol)->getLen(); i++) {
          inits.push_back(0);
        }
      } else {
        for (auto value : init_values) {
          if (value->_type == NodeType::CNS) {
            inits.push_back(value->_value);
          } else {
            inits.push_back(0);
          }
        }
      }
    }

    if (std::static_pointer_cast<ArraySymbol>(symbol)->getLen() <=
        irGenerator::TopLocalSmallArrayLength) {
      if (!init_values.empty()) {
        initType = irGenerator::localArrayInitType::SmallInit;
      } else {
        initType = irGenerator::localArrayInitType::Small;
      }
    } else {
      if (!init_values.empty()) {
        initType = irGenerator::localArrayInitType::BigInit;
      } else {
        initType = irGenerator::localArrayInitType::BigNoInit;
      }
    }

    irGenerator.ir_declare_value(
        name, kind, symbol->getId(), inits, initType,
        std::static_pointer_cast<ArraySymbol>(symbol)->getLen());
  }

  if (init_values.size() > 0) {
    string valueName = irGenerator.getVarName(name, symbol->getId());
    irGenerator::RightVal rightVal;

    if (symbol->kind() == SymbolKind::Array) {
      string initPtr;
      bool needAssgin;
      int offset = 0;
      RightVal rightvalue1;
      RightVal rightvalue2;

      if (inGlobalLayer()) {
        initPtr = irGenerator.getNewTmpValueName(TyKind::Ptr);
        irGenerator.ir_ref(initPtr, valueName);
      } else {
        initPtr = valueName;
      }

      for (auto var : init_values) {
        needAssgin = false;
        if (symbol->kind() == SymbolKind::Array) {
          std::static_pointer_cast<ArraySymbol>(symbol)->addValue(var);
        }

        if (var->_type == NodeType::CNS && var->_value != 0) {
          rightVal.emplace<0>(var->_value);
          needAssgin = true;
        } else if (var->_type == NodeType::VAR) {
          rightVal.emplace<2>(var->_name);
          needAssgin = true;
        }

        if (needAssgin) {
          if (offset > 0) {
            string addr;

            addr = irGenerator.getNewTmpValueName(mir::types::TyKind::Ptr);
            rightvalue1.emplace<0>(offset * mir::types::INT_SIZE);
            irGenerator.ir_op(addr, initPtr, rightvalue1, Op::Add);
            irGenerator.ir_store(addr, rightVal);
          } else {
            irGenerator.ir_store(initPtr, rightVal);
          }
        }
        offset++;
      }
    } else {
      SharedExNdPtr var = init_values.front();

      if (var->_type == NodeType::CNS) {
        rightVal.emplace<0>(var->_value);
      } else {
        rightVal.emplace<2>(var->_name);
      }

      if (inGlobalLayer()) {
        string addrTmp;

        addrTmp = irGenerator.getNewTmpValueName(TyKind::Ptr);
        irGenerator.ir_ref(addrTmp, valueName);
        irGenerator.ir_store(addrTmp, rightVal);
      } else {
        irGenerator.ir_assign(valueName, rightVal);
      }
    }
  }
  symbolTable.push_symbol(symbol);

  if (!init_values.empty()) {
    if (inGlobalLayer()) {
      if (symbol->kind() == SymbolKind::Array) {
        bool isConst = true;
        std::vector<int32_t> constValues;

        for (auto &value : init_values) {
          if (value->_type == NodeType::CNS) {
            constValues.push_back(value->_value);
          } else {
            isConst = false;
            break;
          }
        }

        if (isConst) {
          std::shared_ptr<optimization::bmir_variable_table::VarArray>
              varArray =
                  std::make_shared<optimization::bmir_variable_table::VarArray>(
                      isConst);

          varArray->initValues.assign(constValues.begin(), constValues.end());
          bmirVariableTable.insertVarArray(
              irGenerator.getVarName(symbol->getName(), symbol->getId()),
              varArray);
        }
      } else if (symbol->kind() == SymbolKind::INT) {
        bool isConst = true;
        int32_t constValue;

        for (auto &value : init_values) {
          if (value->_type == NodeType::CNS) {
            constValue = value->_value;
          } else {
            isConst = false;
            break;
          }
        }

        if (isConst) {
          std::shared_ptr<optimization::bmir_variable_table::VarSingle>
              varSingle = std::make_shared<
                  optimization::bmir_variable_table::VarSingle>(isConst);

          varSingle->initValue = constValue;
          bmirVariableTable.insertVarSingle(
              irGenerator.getVarName(symbol->getName(), symbol->getId()),
              varSingle);
        }
      }
    }
  }
}